

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusTypes.cpp
# Opt level: O3

SMBusByte * __thiscall SMBusByte::ToByteCount(SMBusByte *this)

{
  undefined8 uVar1;
  byte *in_RSI;
  
  Frame::Frame((Frame *)this);
  this[1].value = '\r';
  uVar1 = **(undefined8 **)(in_RSI + 8);
  this->value = (char)uVar1;
  this->is_acked = (bool)(char)((ulong)uVar1 >> 8);
  *(int6 *)&this->field_0x2 = (int6)((ulong)uVar1 >> 0x10);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_start = *(pointer *)(*(long *)(in_RSI + 0x10) + -0x20);
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(ulong)*in_RSI;
  (this->signals).super__Vector_base<SMBusSignalState,_std::allocator<SMBusSignalState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this[1].is_acked = (bool)in_RSI[1];
  return this;
}

Assistant:

Frame SMBusByte::ToByteCount() const
{
    Frame f;

    f.mType = FT_ByteCount;
    f.mStartingSampleInclusive = signals.front().sample_begin;
    f.mEndingSampleInclusive = signals.back().sample_end;
    f.mData1 = value;
    f.mData2 = 0;
    f.mFlags = 0;
    if( is_acked )
        f.mFlags |= F_IsAcked;

    return f;
}